

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

void vkt::pipeline::multisample::uploadVertexDataNdcScreen
               (Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton,
               Vec2 *screenSize)

{
  pointer __src;
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  vertices;
  Vec2 local_60;
  _Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  local_58;
  VertexDataNdcScreen local_40;
  Vec4 local_28;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.m_data[0] = -1.0;
  local_28.m_data[1] = -1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_60.m_data[0] = 0.0;
  local_60.m_data[1] = 0.0;
  VertexDataNdcScreen::VertexDataNdcScreen(&local_40,&local_28,&local_60);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>
            ((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
              *)&local_58,&local_40);
  local_28.m_data[0] = 1.0;
  local_28.m_data[1] = -1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_60.m_data[1] = 0.0;
  local_60.m_data[0] = screenSize->m_data[0];
  VertexDataNdcScreen::VertexDataNdcScreen(&local_40,&local_28,&local_60);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>
            ((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
              *)&local_58,&local_40);
  local_28.m_data[0] = -1.0;
  local_28.m_data[1] = 1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_60.m_data = (float  [2])((ulong)(uint)screenSize->m_data[1] << 0x20);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_40,&local_28,&local_60);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>
            ((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
              *)&local_58,&local_40);
  local_28.m_data._0_8_ = &DAT_3f8000003f800000;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  local_60 = *(Vec2 *)screenSize->m_data;
  VertexDataNdcScreen::VertexDataNdcScreen(&local_40,&local_28,&local_60);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::emplace_back<vkt::pipeline::multisample::VertexDataNdcScreen>
            ((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
              *)&local_58,&local_40);
  __src = (pointer)0x0;
  if (local_58._M_impl.super__Vector_impl_data._M_finish !=
      local_58._M_impl.super__Vector_impl_data._M_start) {
    __src = local_58._M_impl.super__Vector_impl_data._M_start;
  }
  memcpy(vertexBufferAllocation->m_hostPtr,__src,vertexDataDescripton->dataSize);
  std::
  _Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void uploadVertexDataNdcScreen (const Allocation& vertexBufferAllocation, const MultisampleInstanceBase::VertexDataDesc& vertexDataDescripton, const tcu::Vec2& screenSize)
{
	std::vector<VertexDataNdcScreen> vertices;

	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(screenSize.x(), 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, screenSize.y())));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(screenSize.x(), screenSize.y())));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}